

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::AddScriptPubKeyMan
          (CWallet *this,uint256 *id,
          unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
          spkm_man)

{
  long lVar1;
  ScriptPubKeyMan *pSVar2;
  ScriptPubKeyMan *pSVar3;
  int iVar4;
  mapped_type *pmVar5;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pmVar5 = std::
           map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           ::operator[](&this->m_spk_managers,id);
  pSVar2 = *(ScriptPubKeyMan **)
            spkm_man._M_t.
            super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
            .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  *(undefined8 *)
   spkm_man._M_t.
   super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>.
   _M_t.
   super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>.
   super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl = 0;
  pSVar3 = (pmVar5->_M_t).
           super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
           .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  (pmVar5->_M_t).
  super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>._M_t
  .super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>.
  super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl = pSVar2;
  if (pSVar3 != (ScriptPubKeyMan *)0x0) {
    (*pSVar3->_vptr_ScriptPubKeyMan[1])();
  }
  iVar4 = (*((pmVar5->_M_t).
             super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
             .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl)->
            _vptr_ScriptPubKeyMan[0x13])();
  if (CONCAT44(extraout_var,iVar4) < (this->m_birth_time).super___atomic_base<long>._M_i) {
    LOCK();
    (this->m_birth_time).super___atomic_base<long>._M_i = CONCAT44(extraout_var,iVar4);
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddScriptPubKeyMan(const uint256& id, std::unique_ptr<ScriptPubKeyMan> spkm_man)
{
    // Add spkm_man to m_spk_managers before calling any method
    // that might access it.
    const auto& spkm = m_spk_managers[id] = std::move(spkm_man);

    // Update birth time if needed
    MaybeUpdateBirthTime(spkm->GetTimeFirstKey());
}